

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrn_x86_fma.cpp
# Opt level: O3

int __thiscall
ncnn::LRN_x86_fma::forward_inplace(LRN_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  size_t _elemsize;
  bool bVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  int *piVar10;
  undefined1 auVar11 [32];
  pointer piVar12;
  uint uVar13;
  _func_int **pp_Var14;
  int iVar15;
  ulong uVar16;
  _func_int ***ppp_Var17;
  _func_int *p_Var18;
  ulong uVar19;
  int iVar20;
  float *pfVar21;
  _func_int ***ppp_Var22;
  void *pvVar23;
  int iVar24;
  int iVar25;
  uint uVar26;
  int iVar27;
  long lVar28;
  uint uVar29;
  int iVar30;
  uint uVar31;
  undefined1 (*pauVar32) [32];
  long lVar33;
  float fVar34;
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  allocator_type local_1e1;
  Mat *local_1e0;
  Mat local_1d8;
  ulong local_188;
  undefined8 local_180;
  ulong local_178;
  ulong local_170;
  Mat local_168;
  int local_118;
  int iStack_114;
  int iStack_110;
  int iStack_10c;
  int iStack_108;
  int iStack_104;
  int iStack_100;
  int iStack_fc;
  undefined1 local_f8 [16];
  long local_e8;
  Allocator *local_e0;
  long local_d8;
  void *local_d0;
  long local_c8;
  _func_int ***local_c0;
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  vector<int,_std::allocator<int>_> _space_ofs;
  
  auVar2 = local_b8;
  local_118 = bottom_top_blob->w;
  local_b8._4_4_ = 0;
  local_b8._0_4_ = bottom_top_blob->h;
  uVar29 = bottom_top_blob->c;
  uVar19 = (ulong)uVar29;
  _elemsize = bottom_top_blob->elemsize;
  local_168.cstep = 0;
  local_168.data = (Allocator *)0x0;
  local_168.refcount._0_4_ = 0;
  local_168.refcount._4_4_ = 0;
  local_168.elemsize = SUB168(ZEXT816(0) << 0x40,4);
  local_168.elempack = 0;
  iStack_114 = 0;
  local_b8._8_24_ = auVar2._8_24_;
  local_168.allocator = (Allocator *)local_168.data;
  local_168.dims = (int)local_168.refcount;
  local_168.w = local_168.refcount._4_4_;
  local_168._48_8_ = local_168.elemsize;
  local_168.c = local_168.elempack;
  Mat::create(&local_168,local_118,bottom_top_blob->h,uVar29,_elemsize,opt->workspace_allocator);
  iVar25 = -100;
  if (((Allocator *)local_168.data == (Allocator *)0x0) ||
     ((long)local_168.c * local_168.cstep == 0)) goto LAB_0032e756;
  uVar31 = local_b8._0_4_ * local_118;
  if (0 < (int)uVar29) {
    uVar16 = 0;
    do {
      pfVar21 = (float *)(bottom_top_blob->cstep * uVar16 * bottom_top_blob->elemsize +
                         (long)bottom_top_blob->data);
      ppp_Var17 = (_func_int ***)
                  ((long)(_func_int ***)local_168.data +
                  local_168.cstep * uVar16 * local_168.elemsize);
      if ((int)uVar31 < 8) {
        uVar13 = 0;
      }
      else {
        iVar25 = 7;
        do {
          auVar2._4_4_ = pfVar21[1] * pfVar21[1];
          auVar2._0_4_ = *pfVar21 * *pfVar21;
          auVar2._8_4_ = pfVar21[2] * pfVar21[2];
          auVar2._12_4_ = pfVar21[3] * pfVar21[3];
          auVar2._16_4_ = pfVar21[4] * pfVar21[4];
          auVar2._20_4_ = pfVar21[5] * pfVar21[5];
          auVar2._24_4_ = pfVar21[6] * pfVar21[6];
          auVar2._28_4_ = pfVar21[7];
          *(undefined1 (*) [32])ppp_Var17 = auVar2;
          pfVar21 = pfVar21 + 8;
          ppp_Var17 = ppp_Var17 + 4;
          iVar25 = iVar25 + 8;
          uVar13 = uVar31 & 0xfffffff8;
        } while (iVar25 < (int)uVar31);
      }
      if (uVar31 - uVar13 != 0 && (int)uVar13 <= (int)uVar31) {
        lVar28 = 0;
        do {
          *(float *)((long)ppp_Var17 + lVar28 * 4) = pfVar21[lVar28] * pfVar21[lVar28];
          lVar28 = lVar28 + 1;
        } while (uVar31 - uVar13 != (int)lVar28);
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 != uVar19);
  }
  pp_Var14 = this->_vptr_LRN_x86_fma;
  local_170 = uVar19;
  if (*(int *)(&this->field_0xd0 + (long)pp_Var14[-3]) == 0) {
    local_1d8.cstep = 0;
    local_1d8.data = (Allocator *)0x0;
    local_1d8.refcount._0_4_ = 0;
    local_1d8.refcount._4_4_ = 0;
    local_1d8.elemsize._0_4_ = 0;
    local_1d8.elemsize._4_4_ = 0;
    local_1d8.elempack = 0;
    local_1d8.allocator = (Allocator *)0x0;
    local_1d8.dims = 0;
    local_1d8.w = 0;
    local_1d8.h = 0;
    local_1d8.d = 0;
    local_1d8.c = 0;
    Mat::create(&local_1d8,local_118,local_b8._0_4_,uVar29,_elemsize,opt->workspace_allocator);
    if (((Allocator *)local_1d8.data == (Allocator *)0x0) ||
       (local_1d8.cstep * (long)local_1d8.c == 0)) {
      piVar10 = (int *)CONCAT44(local_1d8.refcount._4_4_,(int)local_1d8.refcount);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if (local_1d8.allocator == (Allocator *)0x0) {
joined_r0x0032e72e:
            if ((Allocator *)local_1d8.data != (Allocator *)0x0) {
              free(local_1d8.data);
            }
          }
          else {
            (*(local_1d8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
LAB_0032e751:
      iVar25 = -100;
      goto LAB_0032e756;
    }
    uVar13 = (int)local_1d8.cstep * local_1d8.c;
    if (0 < (int)uVar13) {
      memset(local_1d8.data,0,(ulong)uVar13 << 2);
    }
    if (0 < (int)uVar29) {
      pp_Var14 = this->_vptr_LRN_x86_fma;
      local_f8._0_4_ =
           *(float *)(&this->field_0xd8 + (long)pp_Var14[-3]) /
           (float)*(int *)(&this->field_0xd4 + (long)pp_Var14[-3]);
      local_f8._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar38 = vshufps_avx(local_f8,local_f8,0);
      local_b8._16_16_ = auVar38;
      local_b8._0_16_ = auVar38;
      uVar16 = 0;
      local_180 = CONCAT44(local_180._4_4_,uVar31) & 0xfffffffffffffff8;
      uVar29 = uVar31 & 0xfffffff8;
      local_1e0 = bottom_top_blob;
      do {
        auVar68._8_4_ = 0x3f000000;
        auVar68._0_8_ = 0x3f0000003f000000;
        auVar65._8_4_ = 0x807fffff;
        auVar65._0_8_ = 0x807fffff807fffff;
        auVar46._8_4_ = 0x800000;
        auVar46._0_8_ = 0x80000000800000;
        auVar68._12_4_ = 0x3f000000;
        auVar65._12_4_ = 0x807fffff;
        auVar46._12_4_ = 0x800000;
        auVar68._16_4_ = 0x3f000000;
        auVar65._16_4_ = 0x807fffff;
        auVar46._16_4_ = 0x800000;
        auVar68._20_4_ = 0x3f000000;
        auVar65._20_4_ = 0x807fffff;
        auVar46._20_4_ = 0x800000;
        auVar68._24_4_ = 0x3f000000;
        auVar65._24_4_ = 0x807fffff;
        auVar46._24_4_ = 0x800000;
        auVar68._28_4_ = 0x3f000000;
        auVar65._28_4_ = 0x807fffff;
        auVar46._28_4_ = 0x800000;
        p_Var18 = pp_Var14[-3];
        iVar25 = *(int *)(&this->field_0xd4 + (long)p_Var18) / 2;
        iVar30 = (int)uVar16;
        uVar13 = iVar30 - iVar25;
        if ((int)uVar13 <= iVar25 + iVar30) {
          do {
            if (uVar13 < (uint)uVar19) {
              ppp_Var17 = (_func_int ***)
                          ((long)(_func_int ***)local_168.data +
                          uVar13 * local_168.cstep * local_168.elemsize);
              ppp_Var22 = (_func_int ***)
                          ((long)(_func_int ***)local_1d8.data +
                          local_1d8.cstep * uVar16 *
                          CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize));
              uVar26 = 0;
              if (7 < (int)uVar31) {
                iVar25 = 7;
                do {
                  auVar35._0_4_ = *(float *)ppp_Var22 + *(float *)ppp_Var17;
                  auVar35._4_4_ = *(float *)((long)ppp_Var22 + 4) + *(float *)((long)ppp_Var17 + 4);
                  auVar35._8_4_ = *(float *)(ppp_Var22 + 1) + *(float *)(ppp_Var17 + 1);
                  auVar35._12_4_ =
                       *(float *)((long)(ppp_Var22 + 1) + 4) + *(float *)((long)(ppp_Var17 + 1) + 4)
                  ;
                  auVar35._16_4_ = *(float *)(ppp_Var22 + 2) + *(float *)(ppp_Var17 + 2);
                  auVar35._20_4_ =
                       *(float *)((long)(ppp_Var22 + 2) + 4) + *(float *)((long)(ppp_Var17 + 2) + 4)
                  ;
                  auVar35._24_4_ = *(float *)(ppp_Var22 + 3) + *(float *)(ppp_Var17 + 3);
                  auVar35._28_4_ =
                       *(float *)((long)(ppp_Var22 + 3) + 4) + *(float *)((long)(ppp_Var17 + 3) + 4)
                  ;
                  *(undefined1 (*) [32])ppp_Var22 = auVar35;
                  ppp_Var17 = ppp_Var17 + 4;
                  ppp_Var22 = ppp_Var22 + 4;
                  iVar25 = iVar25 + 8;
                  uVar26 = uVar29;
                } while (iVar25 < (int)uVar31);
              }
              if (uVar31 - uVar26 != 0 && (int)uVar26 <= (int)uVar31) {
                lVar28 = 0;
                do {
                  *(float *)((long)ppp_Var22 + lVar28 * 4) =
                       *(float *)((long)ppp_Var22 + lVar28 * 4) +
                       *(float *)((long)ppp_Var17 + lVar28 * 4);
                  lVar28 = lVar28 + 1;
                } while (uVar31 - uVar26 != (int)lVar28);
              }
            }
            p_Var18 = pp_Var14[-3];
            bVar1 = (int)uVar13 < *(int *)(&this->field_0xd4 + (long)p_Var18) / 2 + iVar30;
            uVar13 = uVar13 + 1;
          } while (bVar1);
        }
        pauVar32 = (undefined1 (*) [32])
                   (local_1e0->cstep * uVar16 * local_1e0->elemsize + (long)local_1e0->data);
        ppp_Var17 = (_func_int ***)
                    ((long)(_func_int ***)local_1d8.data +
                    local_1d8.cstep * uVar16 *
                    CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize));
        uVar13 = 0;
        if (7 < (int)uVar31) {
          local_118 = *(int *)(&this->field_0xe0 + (long)p_Var18);
          fVar34 = *(float *)(&this->field_0xdc + (long)p_Var18);
          auVar38._0_8_ = CONCAT44(fVar34,fVar34) ^ 0x8000000080000000;
          auVar38._8_4_ = -fVar34;
          auVar38._12_4_ = -fVar34;
          auVar36._16_16_ = auVar38;
          auVar36._0_16_ = auVar38;
          iVar25 = 7;
          auVar37._8_4_ = 0xb95e8083;
          auVar37._0_8_ = 0xb95e8083b95e8083;
          auVar37._12_4_ = 0xb95e8083;
          auVar37._16_4_ = 0xb95e8083;
          auVar37._20_4_ = 0xb95e8083;
          auVar37._24_4_ = 0xb95e8083;
          auVar37._28_4_ = 0xb95e8083;
          auVar39._8_4_ = 0x3f318000;
          auVar39._0_8_ = 0x3f3180003f318000;
          auVar39._12_4_ = 0x3f318000;
          auVar39._16_4_ = 0x3f318000;
          auVar39._20_4_ = 0x3f318000;
          auVar39._24_4_ = 0x3f318000;
          auVar39._28_4_ = 0x3f318000;
          auVar66._8_4_ = 0xffffff81;
          auVar66._0_8_ = 0xffffff81ffffff81;
          auVar66._12_4_ = 0xffffff81;
          auVar67._8_4_ = 0x3f800000;
          auVar67._0_8_ = 0x3f8000003f800000;
          auVar67._12_4_ = 0x3f800000;
          do {
            auVar11._4_4_ = local_118;
            auVar11._0_4_ = local_118;
            auVar11._8_4_ = local_118;
            auVar11._12_4_ = local_118;
            auVar11._16_4_ = local_118;
            auVar11._20_4_ = local_118;
            auVar11._24_4_ = local_118;
            auVar11._28_4_ = local_118;
            auVar5 = vfmadd213ps_fma(*(undefined1 (*) [32])ppp_Var17,local_b8,auVar11);
            auVar3 = vmaxps_avx(ZEXT1632(auVar5),auVar46);
            auVar45 = vpsrld_avx(auVar3._0_16_,0x17);
            auVar2 = vandps_avx(auVar65,auVar3);
            auVar4 = vorps_avx(auVar68,auVar2);
            auVar52._8_4_ = 0x3f3504f3;
            auVar52._0_8_ = 0x3f3504f33f3504f3;
            auVar52._12_4_ = 0x3f3504f3;
            auVar52._16_4_ = 0x3f3504f3;
            auVar52._20_4_ = 0x3f3504f3;
            auVar52._24_4_ = 0x3f3504f3;
            auVar52._28_4_ = 0x3f3504f3;
            auVar35 = vcmpps_avx(auVar52,auVar4,2);
            auVar2 = vandnps_avx(auVar35,auVar4);
            auVar61 = vpsrld_avx(auVar3._16_16_,0x17);
            auVar41._0_4_ = auVar4._0_4_ + -1.0 + auVar2._0_4_;
            auVar41._4_4_ = auVar4._4_4_ + -1.0 + auVar2._4_4_;
            auVar41._8_4_ = auVar4._8_4_ + -1.0 + auVar2._8_4_;
            auVar41._12_4_ = auVar4._12_4_ + -1.0 + auVar2._12_4_;
            auVar41._16_4_ = auVar4._16_4_ + -1.0 + auVar2._16_4_;
            auVar41._20_4_ = auVar4._20_4_ + -1.0 + auVar2._20_4_;
            auVar41._24_4_ = auVar4._24_4_ + -1.0 + auVar2._24_4_;
            auVar41._28_4_ = auVar4._28_4_ + -1.0 + auVar2._28_4_;
            auVar45 = vpsubd_avx(auVar45,auVar35._0_16_);
            auVar61 = vpsubd_avx(auVar61,auVar35._16_16_);
            auVar45 = vpaddd_avx(auVar66,auVar45);
            auVar53._8_4_ = 0x3d9021bb;
            auVar53._0_8_ = 0x3d9021bb3d9021bb;
            auVar53._12_4_ = 0x3d9021bb;
            auVar53._16_4_ = 0x3d9021bb;
            auVar53._20_4_ = 0x3d9021bb;
            auVar53._24_4_ = 0x3d9021bb;
            auVar53._28_4_ = 0x3d9021bb;
            auVar57._8_4_ = 0xbdebd1b8;
            auVar57._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar57._12_4_ = 0xbdebd1b8;
            auVar57._16_4_ = 0xbdebd1b8;
            auVar57._20_4_ = 0xbdebd1b8;
            auVar57._24_4_ = 0xbdebd1b8;
            auVar57._28_4_ = 0xbdebd1b8;
            auVar6 = vfmadd213ps_fma(auVar53,auVar41,auVar57);
            auVar61 = vpaddd_avx(auVar66,auVar61);
            auVar58._8_4_ = 0x3def251a;
            auVar58._0_8_ = 0x3def251a3def251a;
            auVar58._12_4_ = 0x3def251a;
            auVar58._16_4_ = 0x3def251a;
            auVar58._20_4_ = 0x3def251a;
            auVar58._24_4_ = 0x3def251a;
            auVar58._28_4_ = 0x3def251a;
            auVar6 = vfmadd213ps_fma(ZEXT1632(auVar6),auVar41,auVar58);
            auVar59._8_4_ = 0xbdfe5d4f;
            auVar59._0_8_ = 0xbdfe5d4fbdfe5d4f;
            auVar59._12_4_ = 0xbdfe5d4f;
            auVar59._16_4_ = 0xbdfe5d4f;
            auVar59._20_4_ = 0xbdfe5d4f;
            auVar59._24_4_ = 0xbdfe5d4f;
            auVar59._28_4_ = 0xbdfe5d4f;
            auVar6 = vfmadd213ps_fma(ZEXT1632(auVar6),auVar41,auVar59);
            auVar60._8_4_ = 0x3e11e9bf;
            auVar60._0_8_ = 0x3e11e9bf3e11e9bf;
            auVar60._12_4_ = 0x3e11e9bf;
            auVar60._16_4_ = 0x3e11e9bf;
            auVar60._20_4_ = 0x3e11e9bf;
            auVar60._24_4_ = 0x3e11e9bf;
            auVar60._28_4_ = 0x3e11e9bf;
            auVar6 = vfmadd213ps_fma(ZEXT1632(auVar6),auVar41,auVar60);
            auVar3._4_4_ = auVar41._4_4_ * auVar41._4_4_;
            auVar3._0_4_ = auVar41._0_4_ * auVar41._0_4_;
            auVar3._8_4_ = auVar41._8_4_ * auVar41._8_4_;
            auVar3._12_4_ = auVar41._12_4_ * auVar41._12_4_;
            auVar3._16_4_ = auVar41._16_4_ * auVar41._16_4_;
            auVar3._20_4_ = auVar41._20_4_ * auVar41._20_4_;
            auVar3._24_4_ = auVar41._24_4_ * auVar41._24_4_;
            auVar3._28_4_ = 0x3e11e9bf;
            auVar62._8_4_ = 0xbe2aae50;
            auVar62._0_8_ = 0xbe2aae50be2aae50;
            auVar62._12_4_ = 0xbe2aae50;
            auVar62._16_4_ = 0xbe2aae50;
            auVar62._20_4_ = 0xbe2aae50;
            auVar62._24_4_ = 0xbe2aae50;
            auVar62._28_4_ = 0xbe2aae50;
            auVar6 = vfmadd213ps_fma(ZEXT1632(auVar6),auVar41,auVar62);
            auVar63._8_4_ = 0x3e4cceac;
            auVar63._0_8_ = 0x3e4cceac3e4cceac;
            auVar63._12_4_ = 0x3e4cceac;
            auVar63._16_4_ = 0x3e4cceac;
            auVar63._20_4_ = 0x3e4cceac;
            auVar63._24_4_ = 0x3e4cceac;
            auVar63._28_4_ = 0x3e4cceac;
            auVar6 = vfmadd213ps_fma(ZEXT1632(auVar6),auVar41,auVar63);
            auVar64._8_4_ = 0xbe7ffffc;
            auVar64._0_8_ = 0xbe7ffffcbe7ffffc;
            auVar64._12_4_ = 0xbe7ffffc;
            auVar64._16_4_ = 0xbe7ffffc;
            auVar64._20_4_ = 0xbe7ffffc;
            auVar64._24_4_ = 0xbe7ffffc;
            auVar64._28_4_ = 0xbe7ffffc;
            auVar6 = vfmadd213ps_fma(ZEXT1632(auVar6),auVar41,auVar64);
            auVar47._16_16_ = auVar61;
            auVar47._0_16_ = auVar45;
            auVar49._8_4_ = 0x3eaaaaaa;
            auVar49._0_8_ = 0x3eaaaaaa3eaaaaaa;
            auVar49._12_4_ = 0x3eaaaaaa;
            auVar49._16_4_ = 0x3eaaaaaa;
            auVar49._20_4_ = 0x3eaaaaaa;
            auVar49._24_4_ = 0x3eaaaaaa;
            auVar49._28_4_ = 0x3eaaaaaa;
            auVar45 = vfmadd213ps_fma(ZEXT1632(auVar6),auVar41,auVar49);
            auVar4._4_4_ = auVar41._4_4_ * auVar41._4_4_ * auVar41._4_4_ * auVar45._4_4_;
            auVar4._0_4_ = auVar41._0_4_ * auVar41._0_4_ * auVar41._0_4_ * auVar45._0_4_;
            auVar4._8_4_ = auVar41._8_4_ * auVar41._8_4_ * auVar41._8_4_ * auVar45._8_4_;
            auVar4._12_4_ = auVar41._12_4_ * auVar41._12_4_ * auVar41._12_4_ * auVar45._12_4_;
            auVar4._16_4_ = auVar41._16_4_ * auVar41._16_4_ * auVar41._16_4_ * 0.0;
            auVar4._20_4_ = auVar41._20_4_ * auVar41._20_4_ * auVar41._20_4_ * 0.0;
            auVar4._24_4_ = auVar41._24_4_ * auVar41._24_4_ * auVar41._24_4_ * 0.0;
            auVar4._28_4_ = 0x3eaaaaaa;
            auVar35 = vcvtdq2ps_avx(auVar47);
            auVar45 = vfmadd231ps_fma(auVar4,auVar35,auVar37);
            auVar45 = vfmsub231ps_fma(ZEXT1632(auVar45),auVar68,auVar3);
            auVar3 = vsubps_avx(ZEXT1632(auVar45),auVar41);
            auVar2 = vcmpps_avx(ZEXT1632(auVar5),ZEXT832(0) << 0x20,2);
            auVar45 = vfmsub231ps_fma(auVar3,auVar39,auVar35);
            auVar2 = vorps_avx(auVar2,ZEXT1632(auVar45));
            local_98._0_4_ = (undefined4)auVar38._0_8_;
            local_98._4_4_ = (undefined4)(auVar38._0_8_ >> 0x20);
            auVar7._4_4_ = auVar2._4_4_ * (float)local_98._4_4_;
            auVar7._0_4_ = auVar2._0_4_ * (float)local_98._0_4_;
            auVar7._8_4_ = auVar2._8_4_ * auVar38._8_4_;
            auVar7._12_4_ = auVar2._12_4_ * auVar38._12_4_;
            auVar7._16_4_ = auVar2._16_4_ * (float)local_98._0_4_;
            auVar7._20_4_ = auVar2._20_4_ * (float)local_98._4_4_;
            auVar7._24_4_ = auVar2._24_4_ * auVar38._8_4_;
            auVar7._28_4_ = auVar2._28_4_;
            auVar42._8_4_ = 0x42b0c0a5;
            auVar42._0_8_ = 0x42b0c0a542b0c0a5;
            auVar42._12_4_ = 0x42b0c0a5;
            auVar42._16_4_ = 0x42b0c0a5;
            auVar42._20_4_ = 0x42b0c0a5;
            auVar42._24_4_ = 0x42b0c0a5;
            auVar42._28_4_ = 0x42b0c0a5;
            auVar2 = vminps_avx(auVar7,auVar42);
            auVar43._8_4_ = 0xc2b0c0a5;
            auVar43._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar43._12_4_ = 0xc2b0c0a5;
            auVar43._16_4_ = 0xc2b0c0a5;
            auVar43._20_4_ = 0xc2b0c0a5;
            auVar43._24_4_ = 0xc2b0c0a5;
            auVar43._28_4_ = 0xc2b0c0a5;
            auVar35 = vmaxps_avx(auVar2,auVar43);
            auVar44._8_4_ = 0x3fb8aa3b;
            auVar44._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar44._12_4_ = 0x3fb8aa3b;
            auVar44._16_4_ = 0x3fb8aa3b;
            auVar44._20_4_ = 0x3fb8aa3b;
            auVar44._24_4_ = 0x3fb8aa3b;
            auVar44._28_4_ = 0x3fb8aa3b;
            auVar45 = vfmadd213ps_fma(auVar44,auVar35,auVar68);
            auVar3 = vroundps_avx(ZEXT1632(auVar45),1);
            auVar2 = vcmpps_avx(ZEXT1632(auVar45),auVar3,1);
            auVar50._8_4_ = 0x3f800000;
            auVar50._0_8_ = 0x3f8000003f800000;
            auVar50._12_4_ = 0x3f800000;
            auVar50._16_4_ = 0x3f800000;
            auVar50._20_4_ = 0x3f800000;
            auVar50._24_4_ = 0x3f800000;
            auVar50._28_4_ = 0x3f800000;
            auVar2 = vandps_avx(auVar2,auVar50);
            auVar2 = vsubps_avx(auVar3,auVar2);
            auVar45 = vfmsub231ps_fma(auVar35,auVar2,auVar39);
            auVar61 = vfnmsub231ps_fma(ZEXT1632(auVar45),auVar2,auVar37);
            auVar48._8_4_ = 0x39506967;
            auVar48._0_8_ = 0x3950696739506967;
            auVar48._12_4_ = 0x39506967;
            auVar48._16_4_ = 0x39506967;
            auVar48._20_4_ = 0x39506967;
            auVar48._24_4_ = 0x39506967;
            auVar48._28_4_ = 0x39506967;
            auVar51._8_4_ = 0x3ab743ce;
            auVar51._0_8_ = 0x3ab743ce3ab743ce;
            auVar51._12_4_ = 0x3ab743ce;
            auVar51._16_4_ = 0x3ab743ce;
            auVar51._20_4_ = 0x3ab743ce;
            auVar51._24_4_ = 0x3ab743ce;
            auVar51._28_4_ = 0x3ab743ce;
            auVar45 = vfmadd213ps_fma(auVar48,ZEXT1632(auVar61),auVar51);
            auVar8._28_4_ = 0x3ab743ce;
            auVar8._0_28_ =
                 ZEXT1628(CONCAT412(auVar61._12_4_ * auVar61._12_4_,
                                    CONCAT48(auVar61._8_4_ * auVar61._8_4_,
                                             CONCAT44(auVar61._4_4_ * auVar61._4_4_,
                                                      auVar61._0_4_ * auVar61._0_4_))));
            auVar54._8_4_ = 0x3c088908;
            auVar54._0_8_ = 0x3c0889083c088908;
            auVar54._12_4_ = 0x3c088908;
            auVar54._16_4_ = 0x3c088908;
            auVar54._20_4_ = 0x3c088908;
            auVar54._24_4_ = 0x3c088908;
            auVar54._28_4_ = 0x3c088908;
            auVar35 = ZEXT1632(auVar61);
            auVar45 = vfmadd213ps_fma(ZEXT1632(auVar45),auVar35,auVar54);
            auVar55._8_4_ = 0x3d2aa9c1;
            auVar55._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar55._12_4_ = 0x3d2aa9c1;
            auVar55._16_4_ = 0x3d2aa9c1;
            auVar55._20_4_ = 0x3d2aa9c1;
            auVar55._24_4_ = 0x3d2aa9c1;
            auVar55._28_4_ = 0x3d2aa9c1;
            auVar45 = vfmadd213ps_fma(ZEXT1632(auVar45),auVar35,auVar55);
            auVar56._8_4_ = 0x3e2aaaaa;
            auVar56._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar56._12_4_ = 0x3e2aaaaa;
            auVar56._16_4_ = 0x3e2aaaaa;
            auVar56._20_4_ = 0x3e2aaaaa;
            auVar56._24_4_ = 0x3e2aaaaa;
            auVar56._28_4_ = 0x3e2aaaaa;
            auVar45 = vfmadd213ps_fma(ZEXT1632(auVar45),auVar35,auVar56);
            auVar45 = vfmadd213ps_fma(ZEXT1632(auVar45),auVar35,auVar68);
            auVar5 = vfmadd213ps_fma(ZEXT1632(auVar45),auVar8,auVar35);
            auVar45._0_4_ = (int)auVar2._0_4_;
            auVar45._4_4_ = (int)auVar2._4_4_;
            auVar45._8_4_ = (int)auVar2._8_4_;
            auVar45._12_4_ = (int)auVar2._12_4_;
            auVar40._16_4_ = (int)auVar2._16_4_;
            auVar40._0_16_ = auVar45;
            auVar40._20_4_ = (int)auVar2._20_4_;
            auVar40._24_4_ = (int)auVar2._24_4_;
            auVar40._28_4_ = (int)auVar2._28_4_;
            auVar61 = vpslld_avx(auVar45,0x17);
            auVar45 = vpslld_avx(auVar40._16_16_,0x17);
            auVar45 = vpaddd_avx(auVar67,auVar45);
            auVar61 = vpaddd_avx(auVar67,auVar61);
            auVar9._4_4_ = auVar61._4_4_ * *(float *)((long)*pauVar32 + 4);
            auVar9._0_4_ = auVar61._0_4_ * *(float *)*pauVar32;
            auVar9._8_4_ = auVar61._8_4_ * *(float *)((long)*pauVar32 + 8);
            auVar9._12_4_ = auVar61._12_4_ * *(float *)((long)*pauVar32 + 0xc);
            auVar9._16_4_ = auVar45._0_4_ * *(float *)((long)*pauVar32 + 0x10);
            auVar9._20_4_ = auVar45._4_4_ * *(float *)((long)*pauVar32 + 0x14);
            auVar9._24_4_ = auVar45._8_4_ * *(float *)((long)*pauVar32 + 0x18);
            auVar9._28_4_ = auVar45._12_4_;
            auVar45 = vfmadd213ps_fma(auVar9,ZEXT1632(auVar5),auVar9);
            *pauVar32 = ZEXT1632(auVar45);
            ppp_Var17 = ppp_Var17 + 4;
            pauVar32 = pauVar32 + 1;
            iVar25 = iVar25 + 8;
            uVar13 = uVar29;
            iStack_114 = local_118;
            iStack_110 = local_118;
            iStack_10c = local_118;
            iStack_108 = local_118;
            iStack_104 = local_118;
            iStack_100 = local_118;
            iStack_fc = local_118;
            local_98 = auVar36;
          } while (iVar25 < (int)uVar31);
        }
        local_178 = uVar16;
        if (uVar31 - uVar13 != 0 && (int)uVar13 <= (int)uVar31) {
          lVar28 = 0;
          do {
            auVar38 = vfmadd213ss_fma(ZEXT416(*(uint *)((long)ppp_Var17 + lVar28 * 4)),local_f8,
                                      ZEXT416(*(uint *)(&this->field_0xe0 + (long)pp_Var14[-3])));
            fVar34 = powf(auVar38._0_4_,-*(float *)(&this->field_0xdc + (long)pp_Var14[-3]));
            *(float *)((long)*pauVar32 + lVar28 * 4) =
                 fVar34 * *(float *)((long)*pauVar32 + lVar28 * 4);
            lVar28 = lVar28 + 1;
          } while (uVar31 - uVar13 != (int)lVar28);
        }
        uVar16 = local_178 + 1;
        uVar19 = local_170;
        uVar29 = (uint)local_180;
      } while (uVar16 != local_170);
    }
    piVar10 = (int *)CONCAT44(local_1d8.refcount._4_4_,(int)local_1d8.refcount);
    iVar25 = 0;
    if (piVar10 == (int *)0x0) goto LAB_0032e756;
    LOCK();
    *piVar10 = *piVar10 + -1;
    UNLOCK();
    if (*piVar10 != 0) goto LAB_0032e756;
    if (local_1d8.allocator != (Allocator *)0x0) {
      (*(local_1d8.allocator)->_vptr_Allocator[3])();
      goto LAB_0032e756;
    }
  }
  else {
    if (*(int *)(&this->field_0xd0 + (long)pp_Var14[-3]) != 1) {
      iVar25 = 0;
      goto LAB_0032e756;
    }
    piVar10 = (int *)CONCAT44(local_168.refcount._4_4_,(int)local_168.refcount);
    local_1d8.data = local_168.data;
    local_1d8.refcount._0_4_ = (int)local_168.refcount;
    local_1d8.refcount._4_4_ = local_168.refcount._4_4_;
    local_1d8.elemsize._0_4_ = (undefined4)local_168.elemsize;
    local_1d8.elemsize._4_4_ = (undefined4)(local_168.elemsize >> 0x20);
    local_1d8.elempack = local_168.elempack;
    local_1d8.allocator = local_168.allocator;
    local_1d8.dims = local_168.dims;
    local_1d8.w = local_168.w;
    local_1d8.h = local_168.h;
    local_1d8.d = local_168.d;
    local_1d8.c = local_168.c;
    local_1d8.cstep = local_168.cstep;
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + 1;
      UNLOCK();
      pp_Var14 = this->_vptr_LRN_x86_fma;
    }
    p_Var18 = pp_Var14[-3];
    uVar31 = *(uint *)(&this->field_0xd4 + (long)p_Var18);
    iVar25 = local_118;
    if (1 < (int)uVar31) {
      uVar31 = uVar31 >> 1;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = *(pointer *)opt;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)opt->workspace_allocator;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)opt->workspace_allocator;
      iVar25 = ~uVar31 + *(int *)(&this->field_0xd4 + (long)pp_Var14[-3]);
      copy_make_border(&local_168,&local_1d8,uVar31,iVar25,uVar31,iVar25,0,0.0,(Option *)&_space_ofs
                      );
      if (((Allocator *)local_1d8.data == (Allocator *)0x0) ||
         ((long)local_1d8.c * local_1d8.cstep == 0)) {
        piVar10 = (int *)CONCAT44(local_1d8.refcount._4_4_,(int)local_1d8.refcount);
        if (piVar10 != (int *)0x0) {
          LOCK();
          *piVar10 = *piVar10 + -1;
          UNLOCK();
          if (*piVar10 == 0) {
            if (local_1d8.allocator == (Allocator *)0x0) goto joined_r0x0032e72e;
            (*(local_1d8.allocator)->_vptr_Allocator[3])();
          }
        }
        goto LAB_0032e751;
      }
      p_Var18 = this->_vptr_LRN_x86_fma[-3];
      uVar31 = *(uint *)(&this->field_0xd4 + (long)p_Var18);
      iVar25 = local_1d8.w;
    }
    local_98._0_4_ = uVar31;
    uVar31 = uVar31 * uVar31;
    local_f8._0_4_ = *(undefined4 *)(&this->field_0xd8 + (long)p_Var18);
    std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,(ulong)uVar31,&local_1e1);
    piVar12 = _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    pp_Var14 = this->_vptr_LRN_x86_fma;
    iVar30 = *(int *)(&this->field_0xd4 + (long)pp_Var14[-3]);
    if (0 < iVar30) {
      iVar25 = iVar25 - iVar30;
      iVar15 = 0;
      iVar20 = 0;
      iVar24 = 0;
      do {
        if (0 < iVar30) {
          lVar28 = 0;
          do {
            _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start[iVar24 + lVar28] = iVar20 + (int)lVar28;
            iVar30 = *(int *)(&this->field_0xd4 + (long)pp_Var14[-3]);
            lVar28 = lVar28 + 1;
            iVar27 = (int)lVar28;
          } while (iVar27 < iVar30);
          iVar24 = iVar24 + iVar27;
          iVar20 = iVar20 + iVar27;
        }
        iVar20 = iVar20 + iVar25;
        iVar15 = iVar15 + 1;
      } while (iVar15 < iVar30);
    }
    if (0 < (int)uVar29) {
      local_180 = (ulong)local_118;
      local_d0 = bottom_top_blob->data;
      local_d8 = bottom_top_blob->cstep * bottom_top_blob->elemsize;
      local_e0 = (Allocator *)local_1d8.data;
      local_e8 = local_1d8.cstep * CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize)
      ;
      local_c8 = (long)local_1d8.w *
                 CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize);
      local_178 = CONCAT44(local_178._4_4_,1.0 / (float)(int)uVar31);
      local_188 = 0;
      do {
        if (0 < (int)local_b8._0_4_) {
          local_c0 = (_func_int ***)((long)&local_e0->_vptr_Allocator + local_e8 * local_188);
          pvVar23 = (void *)(local_d8 * local_188 + (long)local_d0);
          pp_Var14 = this->_vptr_LRN_x86_fma;
          local_1e0 = (Mat *)0x0;
          do {
            ppp_Var17 = local_c0;
            if (0 < local_118) {
              lVar28 = local_c8 * (long)local_1e0;
              lVar33 = 0;
              do {
                if (local_98._0_4_ == 0) {
                  fVar34 = 0.0;
                }
                else {
                  fVar34 = 0.0;
                  uVar19 = 0;
                  do {
                    fVar34 = fVar34 + *(float *)((long)ppp_Var17 +
                                                (long)piVar12[uVar19] * 4 + lVar33 * 4 + lVar28);
                    uVar19 = uVar19 + 1;
                  } while (uVar31 + (uVar31 == 0) != uVar19);
                }
                auVar38 = vfmadd213ss_fma(ZEXT416((uint)(fVar34 * (float)local_f8._0_4_)),
                                          ZEXT416((uint)local_178),
                                          ZEXT416(*(uint *)(&this->field_0xe0 + (long)pp_Var14[-3]))
                                         );
                fVar34 = powf(auVar38._0_4_,-*(float *)(&this->field_0xdc + (long)pp_Var14[-3]));
                *(float *)((long)pvVar23 + lVar33 * 4) =
                     fVar34 * *(float *)((long)pvVar23 + lVar33 * 4);
                lVar33 = lVar33 + 1;
              } while (lVar33 != CONCAT44(iStack_114,local_118));
            }
            pvVar23 = (void *)((long)pvVar23 + local_180 * 4);
            local_1e0 = (Mat *)((long)&local_1e0->data + 1);
          } while (local_1e0 != (Mat *)local_b8._0_8_);
        }
        local_188 = local_188 + 1;
      } while (local_188 != local_170);
    }
    if (piVar12 != (pointer)0x0) {
      operator_delete(piVar12,(long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                    .super__Vector_impl_data._M_end_of_storage - (long)piVar12);
    }
    piVar10 = (int *)CONCAT44(local_1d8.refcount._4_4_,(int)local_1d8.refcount);
    iVar25 = 0;
    if (piVar10 == (int *)0x0) goto LAB_0032e756;
    LOCK();
    *piVar10 = *piVar10 + -1;
    UNLOCK();
    if (*piVar10 != 0) goto LAB_0032e756;
    if (local_1d8.allocator != (Allocator *)0x0) {
      (*(local_1d8.allocator)->_vptr_Allocator[3])();
      goto LAB_0032e756;
    }
  }
  iVar25 = 0;
  if ((Allocator *)local_1d8.data != (Allocator *)0x0) {
    iVar25 = 0;
    free(local_1d8.data);
  }
LAB_0032e756:
  piVar10 = (int *)CONCAT44(local_168.refcount._4_4_,(int)local_168.refcount);
  if (piVar10 != (int *)0x0) {
    LOCK();
    *piVar10 = *piVar10 + -1;
    UNLOCK();
    if (*piVar10 == 0) {
      if (local_168.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_168.data != (Allocator *)0x0) {
          free(local_168.data);
        }
      }
      else {
        (*(local_168.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar25;
}

Assistant:

int LRN_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    size_t elemsize = bottom_top_blob.elemsize;
    int size = w * h;

    // squared values with local_size padding
    Mat square_blob;
    square_blob.create(w, h, channels, elemsize, opt.workspace_allocator);
    if (square_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = bottom_top_blob.channel(q);
        float* outptr = square_blob.channel(q);

        int i = 0;
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = _mm256_mul_ps(_p, _p);
            _mm256_storeu_ps(outptr, _outp);

            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i < size; i++)
        {
            *outptr = *ptr * *ptr;

            ptr++;
            outptr++;
        }
    }

    if (region_type == NormRegion_ACROSS_CHANNELS)
    {
        Mat square_sum;
        square_sum.create(w, h, channels, elemsize, opt.workspace_allocator);
        if (square_sum.empty())
            return -100;
        square_sum.fill(0.f);

        const float alpha_div_size = alpha / local_size;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            // square sum
            for (int p = q - local_size / 2; p <= q + local_size / 2; p++)
            {
                if (p < 0 || p >= channels)
                    continue;

                const float* sptr = square_blob.channel(p);
                float* ssptr = square_sum.channel(q);

                int i = 0;
#if __AVX__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _sp = _mm256_loadu_ps(sptr);
                    __m256 _ssp = _mm256_loadu_ps(ssptr);
                    _ssp = _mm256_add_ps(_ssp, _sp);
                    _mm256_storeu_ps(ssptr, _ssp);

                    sptr += 8;
                    ssptr += 8;
                }
#endif // __AVX__
                for (; i < size; i++)
                {
                    *ssptr += *sptr;
                    sptr++;
                    ssptr++;
                }
            }

            float* ptr = bottom_top_blob.channel(q);
            float* ssptr = square_sum.channel(q);

            int i = 0;
#if __AVX__
            __m256 _bias = _mm256_set1_ps(bias);
            __m256 _ads = _mm256_set1_ps(alpha_div_size);
            __m256 _mb = _mm256_set1_ps(-beta);
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _ssp = _mm256_loadu_ps(ssptr);
                _ssp = _mm256_mul_ps(_ssp, _ads);
                _ssp = _mm256_add_ps(_ssp, _bias);
                _ssp = pow256_ps(_ssp, _mb);
                _p = _mm256_mul_ps(_p, _ssp);
                _mm256_storeu_ps(ptr, _p);

                ssptr += 8;
                ptr += 8;
            }
#endif // __AVX__
            for (; i < size; i++)
            {
                *ptr = *ptr * pow(bias + alpha_div_size * *ssptr, -beta);

                ssptr++;
                ptr++;
            }
        }
    }
    else if (region_type == NormRegion_WITHIN_CHANNEL)
    {
        int outw = w;
        int outh = h;

        Mat square_blob_bordered = square_blob;
        int pad = local_size / 2;
        if (pad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(square_blob, square_blob_bordered, pad, local_size - pad - 1, pad, local_size - pad - 1, BORDER_CONSTANT, 0.f, opt_b);
            if (square_blob_bordered.empty())
                return -100;

            w = square_blob_bordered.w;
            h = square_blob_bordered.h;
        }

        const int maxk = local_size * local_size;

        const float alpha_div_size = alpha / maxk;

        // norm window offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - local_size;
            for (int i = 0; i < local_size; i++)
            {
                for (int j = 0; j < local_size; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            const Mat m = square_blob_bordered.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i) + j;

                    float ss = 0.f;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[space_ofs[k]];
                        ss += val;
                    }

                    ptr[j] = ptr[j] * pow(bias + alpha_div_size * ss, -beta);
                }

                ptr += outw;
            }
        }
    }

    return 0;
}